

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::Columns(int columns_count,char *id,bool border)

{
  ImVector<ImGuiColumnData> *this;
  float fVar1;
  ImGuiWindow *this_00;
  bool bVar2;
  ImGuiID IVar3;
  ImU32 col;
  value_type *pvVar4;
  int column_index;
  int iVar5;
  ImDrawList *this_01;
  int i;
  int column_index_00;
  char *str;
  byte bVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  bool held;
  bool hovered;
  ImGuiID column_id;
  float local_7c;
  ImGuiContext *g;
  float local_70;
  float local_6c;
  ImRect column_rect;
  ImVec2 local_40;
  ImVec2 local_38;
  
  g = GImGui;
  this_00 = GImGui->CurrentWindow;
  this_00->Accessed = true;
  if (0 < columns_count) {
    if ((this_00->DC).ColumnsCount != 1) {
      if ((this_00->DC).ColumnsCurrent != 0) {
        column_rect.Min.x = 0.0;
        column_rect.Min.y = 0.0;
        ItemSize(&column_rect.Min,0.0);
      }
      PopItemWidth();
      PopClipRect();
      ImDrawList::ChannelsMerge(this_00->DrawList);
      fVar8 = (this_00->DC).ColumnsCellMaxY;
      fVar9 = (this_00->DC).CursorPos.y;
      uVar7 = -(uint)(fVar9 <= fVar8);
      fVar8 = (float)(~uVar7 & (uint)fVar9 | (uint)fVar8 & uVar7);
      (this_00->DC).ColumnsCellMaxY = fVar8;
      (this_00->DC).CursorPos.y = fVar8;
      iVar5 = (this_00->DC).ColumnsCount;
      if (((iVar5 != 1 && iVar5 != columns_count) && ((this_00->DC).ColumnsShowBorders == true)) &&
         (this_00->SkipItems == false)) {
        local_7c = (this_00->DC).CursorPos.y;
        local_6c = (this_00->DC).ColumnsStartPosY;
        local_70 = local_6c + 1.0;
        column_index_00 = 1;
        while( true ) {
          if (iVar5 <= column_index_00) break;
          fVar8 = (this_00->Pos).x;
          fVar9 = GetColumnOffset(column_index_00);
          fVar9 = fVar9 + fVar8;
          column_id = (this_00->DC).ColumnsSetId + column_index_00;
          column_rect.Max.x = fVar9 + 4.0;
          column_rect.Min.y = local_6c;
          column_rect.Min.x = fVar9 + -4.0;
          column_rect.Max.y = local_7c;
          bVar2 = IsClippedEx(&column_rect,&column_id,false);
          if (!bVar2) {
            bVar6 = 0;
            ButtonBehavior(&column_rect,column_id,&hovered,&held,0);
            if (((hovered | held) & 1U) != 0) {
              bVar6 = hovered ^ 1U | held;
              g->MouseCursor = 4;
            }
            uVar7 = hovered | 0x1c;
            if ((bVar6 & 1) != 0) {
              uVar7 = 0x1e;
            }
            col = GetColorU32(uVar7,1.0);
            local_40.x = (float)(int)fVar9;
            local_38.y = local_70;
            local_40.y = local_7c;
            local_38.x = local_40.x;
            ImDrawList::AddLine(this_00->DrawList,&local_38,&local_40,col,1.0);
            if (held == true) {
              if (g->ActiveIdIsJustActivated == true) {
                (g->ActiveIdClickOffset).x = (g->ActiveIdClickOffset).x + -4.0;
              }
              fVar8 = GetDraggedColumnOffset(column_index_00);
              SetColumnOffset(column_index_00,fVar8);
            }
          }
          column_index_00 = column_index_00 + 1;
          iVar5 = (this_00->DC).ColumnsCount;
        }
      }
    }
    iVar5 = columns_count + 0x11223347;
    if (id != (char *)0x0) {
      iVar5 = 0x11223347;
    }
    str = "columns";
    if (id != (char *)0x0) {
      str = id;
    }
    PushID(iVar5);
    IVar3 = ImGuiWindow::GetID(this_00,str,(char *)0x0);
    (this_00->DC).ColumnsSetId = IVar3;
    PopID();
    (this_00->DC).ColumnsCurrent = 0;
    (this_00->DC).ColumnsCount = columns_count;
    (this_00->DC).ColumnsShowBorders = border;
    fVar8 = (this_00->SizeContentsExplicit).x;
    fVar9 = 0.0;
    if ((fVar8 == 0.0) && (!NAN(fVar8))) {
      fVar8 = (this_00->Size).x;
    }
    fVar1 = (this_00->DC).IndentX;
    (this_00->DC).ColumnsMinX = fVar1;
    if ((this_00->Flags & 8) == 0) {
      fVar9 = (g->Style).ScrollbarSize;
    }
    (this_00->DC).ColumnsMaxX = (fVar8 - (this_00->Scroll).x) - fVar9;
    fVar8 = (this_00->DC).CursorPos.y;
    (this_00->DC).ColumnsStartPosY = fVar8;
    (this_00->DC).ColumnsCellMaxY = fVar8;
    (this_00->DC).ColumnsCellMinY = fVar8;
    (this_00->DC).ColumnsOffsetX = 0.0;
    (this_00->DC).CursorPos.x = (float)(int)(fVar1 + (this_00->Pos).x + 0.0);
    this = &(this_00->DC).ColumnsData;
    if (columns_count == 1) {
      ImVector<ImGuiColumnData>::resize(this,0);
    }
    else {
      ImVector<ImGuiColumnData>::resize(this,columns_count + 1);
      for (iVar5 = 0; iVar5 <= columns_count; iVar5 = iVar5 + 1) {
        IVar3 = (this_00->DC).ColumnsSetId + iVar5;
        if (IVar3 == GImGui->ActiveId) {
          GImGui->ActiveIdIsAlive = true;
        }
        fVar8 = ImGuiStorage::GetFloat
                          ((this_00->DC).StateStorage,IVar3,
                           (float)iVar5 / (float)(this_00->DC).ColumnsCount);
        pvVar4 = ImVector<ImGuiColumnData>::operator[](this,iVar5);
        pvVar4->OffsetNorm = fVar8;
      }
      this_01 = this_00->DrawList;
      ImDrawList::ChannelsSplit(this_01,(this_00->DC).ColumnsCount);
      PushColumnClipRect((int)this_01);
      fVar8 = GetColumnWidth(-1);
      PushItemWidth(fVar8 * 0.65);
    }
    return;
  }
  __assert_fail("columns_count >= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                ,0x2495,"void ImGui::Columns(int, const char *, bool)");
}

Assistant:

void ImGui::Columns(int columns_count, const char* id, bool border)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    IM_ASSERT(columns_count >= 1);

    if (window->DC.ColumnsCount != 1)
    {
        if (window->DC.ColumnsCurrent != 0)
            ItemSize(ImVec2(0,0));   // Advance to column 0
        PopItemWidth();
        PopClipRect();
        window->DrawList->ChannelsMerge();

        window->DC.ColumnsCellMaxY = ImMax(window->DC.ColumnsCellMaxY, window->DC.CursorPos.y);
        window->DC.CursorPos.y = window->DC.ColumnsCellMaxY;
    }

    // Draw columns borders and handle resize at the time of "closing" a columns set
    if (window->DC.ColumnsCount != columns_count && window->DC.ColumnsCount != 1 && window->DC.ColumnsShowBorders && !window->SkipItems)
    {
        const float y1 = window->DC.ColumnsStartPosY;
        const float y2 = window->DC.CursorPos.y;
        for (int i = 1; i < window->DC.ColumnsCount; i++)
        {
            float x = window->Pos.x + GetColumnOffset(i);
            const ImGuiID column_id = window->DC.ColumnsSetId + ImGuiID(i);
            const ImRect column_rect(ImVec2(x-4,y1),ImVec2(x+4,y2));
            if (IsClippedEx(column_rect, &column_id, false))
                continue;

            bool hovered, held;
            ButtonBehavior(column_rect, column_id, &hovered, &held);
            if (hovered || held)
                g.MouseCursor = ImGuiMouseCursor_ResizeEW;

            // Draw before resize so our items positioning are in sync with the line being drawn
            const ImU32 col = GetColorU32(held ? ImGuiCol_ColumnActive : hovered ? ImGuiCol_ColumnHovered : ImGuiCol_Column);
            const float xi = (float)(int)x;
            window->DrawList->AddLine(ImVec2(xi, y1+1.0f), ImVec2(xi, y2), col);

            if (held)
            {
                if (g.ActiveIdIsJustActivated)
                    g.ActiveIdClickOffset.x -= 4;   // Store from center of column line (we used a 8 wide rect for columns clicking)
                x = GetDraggedColumnOffset(i);
                SetColumnOffset(i, x);
            }
        }
    }

    // Differentiate column ID with an arbitrary prefix for cases where users name their columns set the same as another widget.
    // In addition, when an identifier isn't explicitly provided we include the number of columns in the hash to make it uniquer.
    PushID(0x11223347 + (id ? 0 : columns_count));
    window->DC.ColumnsSetId = window->GetID(id ? id : "columns");
    PopID();

    // Set state for first column
    window->DC.ColumnsCurrent = 0;
    window->DC.ColumnsCount = columns_count;
    window->DC.ColumnsShowBorders = border;

    const float content_region_width = (window->SizeContentsExplicit.x != 0.0f) ? window->SizeContentsExplicit.x : window->Size.x;
    window->DC.ColumnsMinX = window->DC.IndentX; // Lock our horizontal range
    window->DC.ColumnsMaxX = content_region_width - window->Scroll.x - ((window->Flags & ImGuiWindowFlags_NoScrollbar) ? 0 : g.Style.ScrollbarSize);// - window->WindowPadding().x;
    window->DC.ColumnsStartPosY = window->DC.CursorPos.y;
    window->DC.ColumnsCellMinY = window->DC.ColumnsCellMaxY = window->DC.CursorPos.y;
    window->DC.ColumnsOffsetX = 0.0f;
    window->DC.CursorPos.x = (float)(int)(window->Pos.x + window->DC.IndentX + window->DC.ColumnsOffsetX);

    if (window->DC.ColumnsCount != 1)
    {
        // Cache column offsets
        window->DC.ColumnsData.resize(columns_count + 1);
        for (int column_index = 0; column_index < columns_count + 1; column_index++)
        {
            const ImGuiID column_id = window->DC.ColumnsSetId + ImGuiID(column_index);
            KeepAliveID(column_id);
            const float default_t = column_index / (float)window->DC.ColumnsCount;
            const float t = window->DC.StateStorage->GetFloat(column_id, default_t);      // Cheaply store our floating point value inside the integer (could store a union into the map?)
            window->DC.ColumnsData[column_index].OffsetNorm = t;
        }
        window->DrawList->ChannelsSplit(window->DC.ColumnsCount);
        PushColumnClipRect();
        PushItemWidth(GetColumnWidth() * 0.65f);
    }
    else
    {
        window->DC.ColumnsData.resize(0);
    }
}